

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_trie.c
# Opt level: O0

int32 ngram_model_trie_raw_score
                (ngram_model_t *base,int32 wid,int32 *hist,int32 n_hist,int32 *n_used)

{
  float fVar1;
  ngram_model_trie_t *model;
  int32 i;
  int32 *n_used_local;
  int32 n_hist_local;
  int32 *hist_local;
  int32 wid_local;
  ngram_model_t *base_local;
  
  n_used_local._4_4_ = n_hist;
  if ((int)(base->n - 1) < n_hist) {
    n_used_local._4_4_ = base->n - 1;
  }
  model._4_4_ = 0;
  do {
    if (n_used_local._4_4_ <= model._4_4_) {
LAB_001173d4:
      fVar1 = lm_trie_score(*(lm_trie_t **)(base + 1),(uint)base->n,wid,hist,n_used_local._4_4_,
                            n_used);
      return (int)fVar1;
    }
    if (hist[model._4_4_] < 0) {
      n_used_local._4_4_ = model._4_4_;
      goto LAB_001173d4;
    }
    model._4_4_ = model._4_4_ + 1;
  } while( true );
}

Assistant:

static int32
ngram_model_trie_raw_score(ngram_model_t * base, int32 wid, int32 * hist,
                           int32 n_hist, int32 * n_used)
{
    int32 i;
    ngram_model_trie_t *model = (ngram_model_trie_t *) base;

    if (n_hist > model->base.n - 1)
        n_hist = model->base.n - 1;
    for (i = 0; i < n_hist; i++) {
        if (hist[i] < 0) {
            n_hist = i;
            break;
        }
    }

    return (int32) lm_trie_score(model->trie, model->base.n, wid, hist,
                                 n_hist, n_used);
}